

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_address.cpp
# Opt level: O2

int CfdGetPeginAddress(void *handle,int mainchain_network_type,char *fedpeg_script,int hash_type,
                      char *pubkey,char *redeem_script,char **pegin_address,char **claim_script,
                      char **tweaked_fedpeg_script)

{
  bool bVar1;
  NetType mainchain_net_type;
  AddressType address_type;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  CfdException *pCVar5;
  Script *this;
  allocator local_25a;
  bool is_bitcoin;
  pointer local_238;
  char *work_script;
  char *work_address;
  Script tweak_fedpegscript;
  Script claim_script_obj;
  Address addr;
  
  work_address = (char *)0x0;
  work_script = (char *)0x0;
  local_238 = (pointer)handle;
  cfd::Initialize();
  if (pegin_address == (char **)0x0) {
    addr._0_8_ = (long)
                 "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_address.cpp"
                 + 0x56;
    addr.witness_ver_ = 0xaa;
    addr.address_._M_dataplus._M_p = "CfdGetPeginAddress";
    cfd::core::logger::warn<>((CfdSourceLocation *)&addr,"pegin_address is null.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&addr,"Failed to parameter. pegin_address is null.",
               (allocator *)&claim_script_obj);
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&addr);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (pubkey == (char *)0x0 && redeem_script == (char *)0x0) {
    addr._0_8_ = (long)
                 "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_address.cpp"
                 + 0x56;
    addr.witness_ver_ = 0xb0;
    addr.address_._M_dataplus._M_p = "CfdGetPeginAddress";
    cfd::core::logger::warn<>((CfdSourceLocation *)&addr,"pubkey and script is null.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&addr,"Failed to parameter. pubkey and script is null.",
               (allocator *)&claim_script_obj);
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&addr);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (claim_script == (char **)0x0) {
    addr._0_8_ = (long)
                 "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_address.cpp"
                 + 0x56;
    addr.witness_ver_ = 0xb6;
    addr.address_._M_dataplus._M_p = "CfdGetPeginAddress";
    cfd::core::logger::warn<>((CfdSourceLocation *)&addr,"claim_script is null.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&addr,"Failed to parameter. claim_script is null.",
               (allocator *)&claim_script_obj);
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&addr);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(fedpeg_script);
  if (bVar1) {
    addr._0_8_ = (long)
                 "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_address.cpp"
                 + 0x56;
    addr.witness_ver_ = 0xbc;
    addr.address_._M_dataplus._M_p = "CfdGetPeginAddress";
    cfd::core::logger::warn<>((CfdSourceLocation *)&addr,"fedpeg_script is null or empty.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&addr,"Failed to parameter. fedpeg_script is null or empty.",
               (allocator *)&claim_script_obj);
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&addr);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  is_bitcoin = false;
  mainchain_net_type = cfd::capi::ConvertNetType(mainchain_network_type,&is_bitcoin);
  if (is_bitcoin == false) {
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&addr,"Invalid network type. need mainchain network type.",
               (allocator *)&claim_script_obj);
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalStateError,(string *)&addr);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  address_type = cfd::capi::ConvertHashToAddressType(hash_type);
  cfd::core::Script::Script(&claim_script_obj);
  if (pubkey != (char *)0x0) {
    std::__cxx11::string::string((string *)&addr,pubkey,(allocator *)&stack0xfffffffffffffda8);
    cfd::core::ByteData::ByteData((ByteData *)&tweak_fedpegscript,(string *)&addr);
    bVar1 = cfd::core::Pubkey::IsValid((ByteData *)&tweak_fedpegscript);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tweak_fedpegscript);
    std::__cxx11::string::~string((string *)&addr);
    if (bVar1) {
      std::__cxx11::string::string((string *)&tweak_fedpegscript,pubkey,&local_25a);
      cfd::core::Pubkey::Pubkey((Pubkey *)&stack0xfffffffffffffda8,(string *)&tweak_fedpegscript);
      cfd::core::ScriptUtil::CreateP2wpkhLockingScript
                ((Script *)&addr,(Pubkey *)&stack0xfffffffffffffda8);
      cfd::core::Script::operator=(&claim_script_obj,(Script *)&addr);
      cfd::core::Script::~Script((Script *)&addr);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &stack0xfffffffffffffda8);
      this = &tweak_fedpegscript;
      goto LAB_00361768;
    }
  }
  std::__cxx11::string::string((string *)&stack0xfffffffffffffda8,redeem_script,&local_25a);
  cfd::core::Script::Script(&tweak_fedpegscript,(string *)&stack0xfffffffffffffda8);
  cfd::core::ScriptUtil::CreateP2wshLockingScript((Script *)&addr,&tweak_fedpegscript);
  cfd::core::Script::operator=(&claim_script_obj,(Script *)&addr);
  cfd::core::Script::~Script((Script *)&addr);
  cfd::core::Script::~Script(&tweak_fedpegscript);
  this = (Script *)&stack0xfffffffffffffda8;
LAB_00361768:
  std::__cxx11::string::~string((string *)this);
  std::__cxx11::string::string((string *)&stack0xfffffffffffffda8,fedpeg_script,&local_25a);
  cfd::core::Script::Script((Script *)&addr,(string *)&stack0xfffffffffffffda8);
  cfd::core::ContractHashUtil::GetContractScript
            (&tweak_fedpegscript,&claim_script_obj,(Script *)&addr);
  cfd::core::Script::~Script((Script *)&addr);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffda8);
  cfd::ElementsAddressFactory::CreatePegInAddress
            (&addr,mainchain_net_type,address_type,&tweak_fedpegscript);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)&stack0xfffffffffffffda8,&addr);
  pcVar2 = cfd::capi::CreateString((string *)&stack0xfffffffffffffda8);
  work_address = pcVar2;
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffda8);
  cfd::core::Script::GetHex_abi_cxx11_((string *)&stack0xfffffffffffffda8,&claim_script_obj);
  pcVar3 = cfd::capi::CreateString((string *)&stack0xfffffffffffffda8);
  work_script = pcVar3;
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffda8);
  if (tweaked_fedpeg_script == (char **)0x0) {
    *pegin_address = pcVar2;
    *claim_script = pcVar3;
  }
  else {
    cfd::core::Script::GetHex_abi_cxx11_((string *)&stack0xfffffffffffffda8,&tweak_fedpegscript);
    pcVar4 = cfd::capi::CreateString((string *)&stack0xfffffffffffffda8);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffda8);
    *pegin_address = pcVar2;
    *claim_script = pcVar3;
    *tweaked_fedpeg_script = pcVar4;
  }
  cfd::core::Address::~Address(&addr);
  cfd::core::Script::~Script(&tweak_fedpegscript);
  cfd::core::Script::~Script(&claim_script_obj);
  return 0;
}

Assistant:

int CfdGetPeginAddress(
    void* handle, int mainchain_network_type, const char* fedpeg_script,
    int hash_type, const char* pubkey, const char* redeem_script,
    char** pegin_address, char** claim_script, char** tweaked_fedpeg_script) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_address = nullptr;
  char* work_script = nullptr;
  char* work_fedpeg_script = nullptr;
  try {
    cfd::Initialize();
    if (pegin_address == nullptr) {
      warn(CFD_LOG_SOURCE, "pegin_address is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pegin_address is null.");
    }
    if ((pubkey == nullptr) && (redeem_script == nullptr)) {
      warn(CFD_LOG_SOURCE, "pubkey and script is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey and script is null.");
    }
    if (claim_script == nullptr) {
      warn(CFD_LOG_SOURCE, "claim_script is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. claim_script is null.");
    }
    if (IsEmptyString(fedpeg_script)) {
      warn(CFD_LOG_SOURCE, "fedpeg_script is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. fedpeg_script is null or empty.");
    }

    bool is_bitcoin = false;
    auto net_type = ConvertNetType(mainchain_network_type, &is_bitcoin);
    if (!is_bitcoin) {
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Invalid network type. need mainchain network type.");
    }
    auto addr_type = ConvertHashToAddressType(hash_type);
    Script claim_script_obj;
    if ((pubkey != nullptr) && Pubkey::IsValid(ByteData(pubkey))) {
      claim_script_obj = ScriptUtil::CreateP2wpkhLockingScript(Pubkey(pubkey));
    } else {
      claim_script_obj =
          ScriptUtil::CreateP2wshLockingScript(Script(redeem_script));
    }

    Script tweak_fedpegscript = ContractHashUtil::GetContractScript(
        claim_script_obj, Script(fedpeg_script));
    auto addr = ElementsAddressFactory::CreatePegInAddress(
        net_type, addr_type, tweak_fedpegscript);

    work_address = CreateString(addr.GetAddress());
    work_script = CreateString(claim_script_obj.GetHex());
    if (tweaked_fedpeg_script != nullptr) {
      work_fedpeg_script = CreateString(tweak_fedpegscript.GetHex());
    }

    *pegin_address = work_address;
    *claim_script = work_script;
    if (tweaked_fedpeg_script != nullptr) {
      *tweaked_fedpeg_script = work_fedpeg_script;
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_address, &work_script, &work_fedpeg_script);
  return result;
}